

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.hpp
# Opt level: O3

void __thiscall
ws::Record::
add_helper<std::__cxx11::string,char_const(&)[7],std::__cxx11::string&,char_const(&)[8],std::__cxx11::string_const&>
          (Record *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *f,
          char (*args) [7],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1
          ,char (*args_2) [8],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3)

{
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (&this->message,(f->_M_dataplus)._M_p,f->_M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&this->message,*args);
  add_helper<std::__cxx11::string&,char_const(&)[8],std::__cxx11::string_const&>
            (this,args_1,args_2,args_3);
  return;
}

Assistant:

void add_helper(T &&f, Args &&...args)
    {
      add(std::forward<T>(f));
      add_helper(std::forward<Args>(args)...);
    }